

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ruby_generator.cc
# Opt level: O3

bool __thiscall
google::protobuf::compiler::ruby::Generator::Generate
          (Generator *this,FileDescriptor *file,string *parameter,
          GeneratorContext *generator_context,string *error)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  Printer printer;
  undefined1 local_a8 [136];
  ZeroCopyOutputStream *output;
  
  if (*(int *)(file + 0x8c) == 3) {
    GetOutputFilename((string *)local_a8,*(string **)file);
    iVar2 = (*generator_context->_vptr_GeneratorContext[2])(generator_context,local_a8);
    output = (ZeroCopyOutputStream *)CONCAT44(extraout_var,iVar2);
    if ((undefined1 *)local_a8._0_8_ != local_a8 + 0x10) {
      operator_delete((void *)local_a8._0_8_,local_a8._16_8_ + 1);
    }
    io::Printer::Printer((Printer *)local_a8,output,'$');
    bVar1 = GenerateFile(file,(Printer *)local_a8,error);
    io::Printer::~Printer((Printer *)local_a8);
    if (output != (ZeroCopyOutputStream *)0x0) {
      (*output->_vptr_ZeroCopyOutputStream[1])(output);
    }
  }
  else {
    bVar1 = false;
    std::__cxx11::string::_M_replace((ulong)error,0,(char *)error->_M_string_length,0x35dfae);
  }
  return bVar1;
}

Assistant:

bool Generator::Generate(
    const FileDescriptor* file,
    const string& parameter,
    GeneratorContext* generator_context,
    string* error) const {

  if (file->syntax() != FileDescriptor::SYNTAX_PROTO3) {
    *error =
        "Can only generate Ruby code for proto3 .proto files.\n"
        "Please add 'syntax = \"proto3\";' to the top of your .proto file.\n";
    return false;
  }

  scoped_ptr<io::ZeroCopyOutputStream> output(
      generator_context->Open(GetOutputFilename(file->name())));
  io::Printer printer(output.get(), '$');

  return GenerateFile(file, &printer, error);
}